

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

int __thiscall
QListModeViewBase::horizontalScrollToValue
          (QListModeViewBase *this,int index,ScrollHint hint,bool leftOf,bool rightOf,QRect *area,
          QRect *rect)

{
  long lVar1;
  bool bVar2;
  ScrollMode SVar3;
  int iVar4;
  Promoted<int,_long_long> PVar5;
  byte in_CL;
  int in_EDX;
  long in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  bool in_stack_0000000f;
  Orientation in_stack_00000010;
  ScrollHint in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  QListModeViewBase *in_stack_00000020;
  int value;
  int in_stack_00000068;
  QRect *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QRect *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined2 uVar6;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_30;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar6 = (undefined2)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar3 = QCommonListViewBase::horizontalScrollMode((QCommonListViewBase *)0x882885);
  if (SVar3 == ScrollPerItem) {
    bVar2 = QList<int>::isEmpty((QList<int> *)0x8828e6);
    if (bVar2) {
      iVar4 = 0;
    }
    else {
      QCommonListViewBase::horizontalScrollBar((QCommonListViewBase *)0x882916);
      QAbstractSlider::value
                ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      QList<int>::at((QList<int> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (qsizetype)in_stack_ffffffffffffff78);
      QList<int>::size((QList<int> *)(in_RDI + 0x28));
      PVar5 = qBound<int,long_long>
                        ((int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (longlong *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      iVar4 = (int)PVar5;
    }
    if ((in_CL & 1) == 0) {
      local_30 = in_EDX;
      if ((in_R8B & 1) != 0) {
        local_30 = 2;
      }
    }
    else {
      local_30 = 1;
    }
    if (local_30 != 0) {
      QRect::width(in_stack_ffffffffffffff78);
      QCommonListViewBase::isWrapping((QCommonListViewBase *)0x8829c5);
      QRect::width(in_stack_ffffffffffffff78);
      iVar4 = perItemScrollToValue
                        (in_stack_00000020,area._4_4_,in_stack_0000001c,in_stack_00000018,
                         in_stack_00000014,in_stack_00000010,in_stack_0000000f,in_stack_00000068);
    }
  }
  else {
    iVar4 = QCommonListViewBase::horizontalScrollToValue
                      ((QCommonListViewBase *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (int)((ulong)in_RDI >> 0x20),(ScrollHint)in_RDI,SUB21((ushort)uVar6 >> 8,0),
                       SUB21(uVar6,0),in_stack_ffffffffffffffa0,
                       (QRect *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QListModeViewBase::horizontalScrollToValue(int index, QListView::ScrollHint hint,
                                            bool leftOf, bool rightOf, const QRect &area, const QRect &rect) const
{
    if (horizontalScrollMode() != QAbstractItemView::ScrollPerItem)
        return QCommonListViewBase::horizontalScrollToValue(index, hint, leftOf, rightOf, area, rect);

    int value;
    if (scrollValueMap.isEmpty())
        value = 0;
    else
        value = qBound(0, scrollValueMap.at(horizontalScrollBar()->value()), flowPositions.size() - 1);
    if (leftOf)
        hint = QListView::PositionAtTop;
    else if (rightOf)
        hint = QListView::PositionAtBottom;
    if (hint == QListView::EnsureVisible)
        return value;

    return perItemScrollToValue(index, value, area.width(), hint, Qt::Horizontal, isWrapping(), rect.width());
}